

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall ImDrawList::UpdateClipRect(ImDrawList *this)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  ImDrawCmd *pIVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined8 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  ImVec4 *pIVar13;
  long lVar14;
  long lVar15;
  ImTextureID pvVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auStack_30 [24];
  ImVec4 curr_clip_rect;
  
  lVar14 = (long)(this->_ClipRectStack).Size;
  pIVar13 = (this->_ClipRectStack).Data + lVar14 + -1;
  if (lVar14 == 0) {
    pIVar13 = &this->_Data->ClipRectFullscreen;
  }
  uVar7._0_4_ = pIVar13->x;
  uVar7._4_4_ = pIVar13->y;
  uVar8 = pIVar13->z;
  uVar9 = pIVar13->w;
  uVar2 = (this->CmdBuffer).Size;
  lVar14 = (long)(int)uVar2;
  pIVar4 = (this->CmdBuffer).Data;
  if ((pIVar4 + lVar14 + -1 != (ImDrawCmd *)0x0 && 0 < lVar14) &&
     (((uVar3 = pIVar4[lVar14 + -1].ElemCount, curr_clip_rect.x._0_1_ = SUB41((float)uVar7,0),
       curr_clip_rect.x._1_1_ = (char)((uint)(float)uVar7 >> 8),
       curr_clip_rect.x._2_1_ = (char)((uint)(float)uVar7 >> 0x10),
       curr_clip_rect.x._3_1_ = (char)((uint)(float)uVar7 >> 0x18),
       curr_clip_rect.y._0_1_ = SUB41(uVar7._4_4_,0),
       curr_clip_rect.y._1_1_ = (char)((uint)uVar7._4_4_ >> 8),
       curr_clip_rect.y._2_1_ = (char)((uint)uVar7._4_4_ >> 0x10),
       curr_clip_rect.y._3_1_ = (char)((uint)uVar7._4_4_ >> 0x18),
       curr_clip_rect.z._0_1_ = (char)uVar8, curr_clip_rect.z._1_1_ = (char)((uint)uVar8 >> 8),
       curr_clip_rect.z._2_1_ = (char)((uint)uVar8 >> 0x10),
       curr_clip_rect.z._3_1_ = (char)((uint)uVar8 >> 0x18), curr_clip_rect.w._0_1_ = (char)uVar9,
       curr_clip_rect.w._1_1_ = (char)((uint)uVar9 >> 8),
       curr_clip_rect.w._2_1_ = (char)((uint)uVar9 >> 0x10),
       curr_clip_rect.w._3_1_ = (char)((uint)uVar9 >> 0x18), uVar3 == 0 ||
       (auVar17[0] = -(*(char *)&pIVar4[lVar14 + -1].ClipRect.x == curr_clip_rect.x._0_1_),
       auVar17[1] = -(*(char *)((long)&pIVar4[lVar14 + -1].ClipRect.x + 1) == curr_clip_rect.x._1_1_
                     ),
       auVar17[2] = -(*(char *)((long)&pIVar4[lVar14 + -1].ClipRect.x + 2) == curr_clip_rect.x._2_1_
                     ),
       auVar17[3] = -(*(char *)((long)&pIVar4[lVar14 + -1].ClipRect.x + 3) == curr_clip_rect.x._3_1_
                     ),
       auVar17[4] = -(*(char *)&pIVar4[lVar14 + -1].ClipRect.y == curr_clip_rect.y._0_1_),
       auVar17[5] = -(*(char *)((long)&pIVar4[lVar14 + -1].ClipRect.y + 1) == curr_clip_rect.y._1_1_
                     ),
       auVar17[6] = -(*(char *)((long)&pIVar4[lVar14 + -1].ClipRect.y + 2) == curr_clip_rect.y._2_1_
                     ),
       auVar17[7] = -(*(char *)((long)&pIVar4[lVar14 + -1].ClipRect.y + 3) == curr_clip_rect.y._3_1_
                     ),
       auVar17[8] = -(*(char *)&pIVar4[lVar14 + -1].ClipRect.z == curr_clip_rect.z._0_1_),
       auVar17[9] = -(*(char *)((long)&pIVar4[lVar14 + -1].ClipRect.z + 1) == curr_clip_rect.z._1_1_
                     ),
       auVar17[10] = -(*(char *)((long)&pIVar4[lVar14 + -1].ClipRect.z + 2) ==
                      curr_clip_rect.z._2_1_),
       auVar17[0xb] = -(*(char *)((long)&pIVar4[lVar14 + -1].ClipRect.z + 3) ==
                       curr_clip_rect.z._3_1_),
       auVar17[0xc] = -(*(char *)&pIVar4[lVar14 + -1].ClipRect.w == curr_clip_rect.w._0_1_),
       auVar17[0xd] = -(*(char *)((long)&pIVar4[lVar14 + -1].ClipRect.w + 1) ==
                       curr_clip_rect.w._1_1_),
       auVar17[0xe] = -(*(char *)((long)&pIVar4[lVar14 + -1].ClipRect.w + 2) ==
                       curr_clip_rect.w._2_1_),
       auVar17[0xf] = -(*(char *)((long)&pIVar4[lVar14 + -1].ClipRect.w + 3) ==
                       curr_clip_rect.w._3_1_),
       (ushort)((ushort)(SUB161(auVar17 >> 7,0) & 1) | (ushort)(SUB161(auVar17 >> 0xf,0) & 1) << 1 |
                (ushort)(SUB161(auVar17 >> 0x17,0) & 1) << 2 |
                (ushort)(SUB161(auVar17 >> 0x1f,0) & 1) << 3 |
                (ushort)(SUB161(auVar17 >> 0x27,0) & 1) << 4 |
                (ushort)(SUB161(auVar17 >> 0x2f,0) & 1) << 5 |
                (ushort)(SUB161(auVar17 >> 0x37,0) & 1) << 6 |
                (ushort)(SUB161(auVar17 >> 0x3f,0) & 1) << 7 |
                (ushort)(SUB161(auVar17 >> 0x47,0) & 1) << 8 |
                (ushort)(SUB161(auVar17 >> 0x4f,0) & 1) << 9 |
                (ushort)(SUB161(auVar17 >> 0x57,0) & 1) << 10 |
                (ushort)(SUB161(auVar17 >> 0x5f,0) & 1) << 0xb |
                (ushort)(SUB161(auVar17 >> 0x67,0) & 1) << 0xc |
                (ushort)(SUB161(auVar17 >> 0x6f,0) & 1) << 0xd |
                (ushort)(SUB161(auVar17 >> 0x77,0) & 1) << 0xe | (ushort)(auVar17[0xf] >> 7) << 0xf)
       == 0xffff)) && (pIVar4[lVar14 + -1].UserCallback == (ImDrawCallback)0x0)))) {
    if (((1 < uVar2) && (uVar3 == 0)) &&
       (auVar18[0] = -(*(char *)&pIVar4[lVar14 + -2].ClipRect.x == curr_clip_rect.x._0_1_),
       auVar18[1] = -(*(char *)((long)&pIVar4[lVar14 + -2].ClipRect.x + 1) == curr_clip_rect.x._1_1_
                     ),
       auVar18[2] = -(*(char *)((long)&pIVar4[lVar14 + -2].ClipRect.x + 2) == curr_clip_rect.x._2_1_
                     ),
       auVar18[3] = -(*(char *)((long)&pIVar4[lVar14 + -2].ClipRect.x + 3) == curr_clip_rect.x._3_1_
                     ),
       auVar18[4] = -(*(char *)&pIVar4[lVar14 + -2].ClipRect.y == curr_clip_rect.y._0_1_),
       auVar18[5] = -(*(char *)((long)&pIVar4[lVar14 + -2].ClipRect.y + 1) == curr_clip_rect.y._1_1_
                     ),
       auVar18[6] = -(*(char *)((long)&pIVar4[lVar14 + -2].ClipRect.y + 2) == curr_clip_rect.y._2_1_
                     ),
       auVar18[7] = -(*(char *)((long)&pIVar4[lVar14 + -2].ClipRect.y + 3) == curr_clip_rect.y._3_1_
                     ),
       auVar18[8] = -(*(char *)&pIVar4[lVar14 + -2].ClipRect.z == curr_clip_rect.z._0_1_),
       auVar18[9] = -(*(char *)((long)&pIVar4[lVar14 + -2].ClipRect.z + 1) == curr_clip_rect.z._1_1_
                     ),
       auVar18[10] = -(*(char *)((long)&pIVar4[lVar14 + -2].ClipRect.z + 2) ==
                      curr_clip_rect.z._2_1_),
       auVar18[0xb] = -(*(char *)((long)&pIVar4[lVar14 + -2].ClipRect.z + 3) ==
                       curr_clip_rect.z._3_1_),
       auVar18[0xc] = -(*(char *)&pIVar4[lVar14 + -2].ClipRect.w == curr_clip_rect.w._0_1_),
       auVar18[0xd] = -(*(char *)((long)&pIVar4[lVar14 + -2].ClipRect.w + 1) ==
                       curr_clip_rect.w._1_1_),
       auVar18[0xe] = -(*(char *)((long)&pIVar4[lVar14 + -2].ClipRect.w + 2) ==
                       curr_clip_rect.w._2_1_),
       auVar18[0xf] = -(*(char *)((long)&pIVar4[lVar14 + -2].ClipRect.w + 3) ==
                       curr_clip_rect.w._3_1_),
       (ushort)((ushort)(SUB161(auVar18 >> 7,0) & 1) | (ushort)(SUB161(auVar18 >> 0xf,0) & 1) << 1 |
                (ushort)(SUB161(auVar18 >> 0x17,0) & 1) << 2 |
                (ushort)(SUB161(auVar18 >> 0x1f,0) & 1) << 3 |
                (ushort)(SUB161(auVar18 >> 0x27,0) & 1) << 4 |
                (ushort)(SUB161(auVar18 >> 0x2f,0) & 1) << 5 |
                (ushort)(SUB161(auVar18 >> 0x37,0) & 1) << 6 |
                (ushort)(SUB161(auVar18 >> 0x3f,0) & 1) << 7 |
                (ushort)(SUB161(auVar18 >> 0x47,0) & 1) << 8 |
                (ushort)(SUB161(auVar18 >> 0x4f,0) & 1) << 9 |
                (ushort)(SUB161(auVar18 >> 0x57,0) & 1) << 10 |
                (ushort)(SUB161(auVar18 >> 0x5f,0) & 1) << 0xb |
                (ushort)(SUB161(auVar18 >> 0x67,0) & 1) << 0xc |
                (ushort)(SUB161(auVar18 >> 0x6f,0) & 1) << 0xd |
                (ushort)(SUB161(auVar18 >> 0x77,0) & 1) << 0xe | (ushort)(auVar18[0xf] >> 7) << 0xf)
       == 0xffff)) {
      lVar15 = (long)(this->_TextureIdStack).Size;
      if (lVar15 == 0) {
        pvVar16 = (ImTextureID)0x0;
      }
      else {
        pvVar16 = (this->_TextureIdStack).Data[lVar15 + -1];
      }
      if ((pIVar4[lVar14 + -2].TextureId == pvVar16) &&
         (pIVar4[lVar14 + -2].UserCallback == (ImDrawCallback)0x0)) {
        iVar1 = (this->CmdBuffer).Size;
        if (0 < iVar1) {
          (this->CmdBuffer).Size = iVar1 + -1;
          return;
        }
        curr_clip_rect.z = 1.637707e-39;
        curr_clip_rect.w = 0.0;
        curr_clip_rect._0_8_ = uVar7;
        __assert_fail("Size > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/kidanger[P]vpe/imgui-1.70/imgui.h"
                      ,0x4ec,"void ImVector<ImDrawCmd>::pop_back() [T = ImDrawCmd]");
      }
    }
    fVar10 = pIVar13->y;
    fVar11 = pIVar13->z;
    fVar12 = pIVar13->w;
    pIVar4[lVar14 + -1].ClipRect.x = pIVar13->x;
    pIVar4[lVar14 + -1].ClipRect.y = fVar10;
    pIVar4[lVar14 + -1].ClipRect.z = fVar11;
    pIVar4[lVar14 + -1].ClipRect.w = fVar12;
    return;
  }
  auStack_30._0_4_ = 0;
  curr_clip_rect.z = 0.0;
  curr_clip_rect.w = 0.0;
  lVar14 = (long)(this->_ClipRectStack).Size;
  pIVar13 = (this->_ClipRectStack).Data + lVar14 + -1;
  if (lVar14 == 0) {
    pIVar13 = &this->_Data->ClipRectFullscreen;
  }
  uVar5 = pIVar13->x;
  uVar6 = pIVar13->y;
  auStack_30._12_4_ = pIVar13->z;
  auStack_30._16_4_ = pIVar13->w;
  lVar14 = (long)(this->_TextureIdStack).Size;
  if (lVar14 == 0) {
    curr_clip_rect._0_8_ = (void *)0x0;
  }
  else {
    curr_clip_rect._0_8_ = (this->_TextureIdStack).Data[lVar14 + -1];
  }
  auStack_30._4_4_ = uVar5;
  auStack_30._8_4_ = uVar6;
  if (((float)uVar5 <= auStack_30._12_4_) && ((float)uVar6 <= auStack_30._16_4_)) {
    ImVector<ImDrawCmd>::push_back(&this->CmdBuffer,(ImDrawCmd *)auStack_30);
    return;
  }
  __assert_fail("draw_cmd.ClipRect.x <= draw_cmd.ClipRect.z && draw_cmd.ClipRect.y <= draw_cmd.ClipRect.w"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/kidanger[P]vpe/imgui-1.70/imgui_draw.cpp"
                ,0x1a3,"void ImDrawList::AddDrawCmd()");
}

Assistant:

void ImDrawList::UpdateClipRect()
{
    // If current command is used with different settings we need to add a new command
    const ImVec4 curr_clip_rect = GetCurrentClipRect();
    ImDrawCmd* curr_cmd = CmdBuffer.Size > 0 ? &CmdBuffer.Data[CmdBuffer.Size-1] : NULL;
    if (!curr_cmd || (curr_cmd->ElemCount != 0 && memcmp(&curr_cmd->ClipRect, &curr_clip_rect, sizeof(ImVec4)) != 0) || curr_cmd->UserCallback != NULL)
    {
        AddDrawCmd();
        return;
    }

    // Try to merge with previous command if it matches, else use current command
    ImDrawCmd* prev_cmd = CmdBuffer.Size > 1 ? curr_cmd - 1 : NULL;
    if (curr_cmd->ElemCount == 0 && prev_cmd && memcmp(&prev_cmd->ClipRect, &curr_clip_rect, sizeof(ImVec4)) == 0 && prev_cmd->TextureId == GetCurrentTextureId() && prev_cmd->UserCallback == NULL)
        CmdBuffer.pop_back();
    else
        curr_cmd->ClipRect = curr_clip_rect;
}